

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

StreamExecutionResult __thiscall
duckdb::BatchedBufferedData::ExecuteTaskInternal
          (BatchedBufferedData *this,StreamQueryResult *result,ClientContextLock *context_lock)

{
  bool bVar1;
  PendingExecutionResult value;
  ClientContext *this_00;
  InternalException *this_01;
  StreamExecutionResult SVar2;
  byte bVar3;
  allocator local_81;
  shared_ptr<duckdb::ClientContext,_true> cc;
  string local_70;
  string local_50;
  
  weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)&cc);
  if (cc.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    SVar2 = EXECUTION_CANCELLED;
  }
  else {
    bVar1 = BufferIsEmpty(this);
    if (bVar1) {
      (*(this->super_BufferedData)._vptr_BufferedData[4])(this);
      this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&cc);
      value = ClientContext::ExecuteTaskInternal
                        (this_00,context_lock,(BaseQueryResult *)result,false);
      bVar1 = BufferIsEmpty(this);
      if (bVar1) {
        SVar2 = BLOCKED;
        if ((value != RESULT_READY) && (value != BLOCKED)) {
          bVar1 = BaseQueryResult::HasError((BaseQueryResult *)result);
          if (bVar1) {
            ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
                      ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)
                       &(this->super_BufferedData).context);
          }
          bVar3 = value - RESULT_NOT_READY;
          if ((4 < bVar3) || ((0x1bU >> (bVar3 & 0x1f) & 1) == 0)) {
            this_01 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_50,
                       "No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
                       &local_81);
            EnumUtil::ToString<duckdb::PendingExecutionResult>(&local_70,value);
            InternalException::InternalException<std::__cxx11::string>(this_01,&local_50,&local_70);
            __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          SVar2 = (StreamExecutionResult)(0x601010201 >> ((bVar3 & 7) << 3));
        }
        goto LAB_00a30313;
      }
    }
    SVar2 = CHUNK_READY;
  }
LAB_00a30313:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cc.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return SVar2;
}

Assistant:

StreamExecutionResult BatchedBufferedData::ExecuteTaskInternal(StreamQueryResult &result,
                                                               ClientContextLock &context_lock) {
	auto cc = context.lock();
	if (!cc) {
		return StreamExecutionResult::EXECUTION_CANCELLED;
	}

	if (!BufferIsEmpty()) {
		// The buffer isn't empty yet, just return
		return StreamExecutionResult::CHUNK_READY;
	}
	// Unblock any pending sinks if the buffer isnt full
	UnblockSinks();
	// Let the executor run until the buffer is no longer empty
	auto execution_result = cc->ExecuteTaskInternal(context_lock, result);
	if (!BufferIsEmpty()) {
		return StreamExecutionResult::CHUNK_READY;
	}
	if (execution_result == PendingExecutionResult::BLOCKED ||
	    execution_result == PendingExecutionResult::RESULT_READY) {
		return StreamExecutionResult::BLOCKED;
	}
	if (result.HasError()) {
		Close();
	}
	switch (execution_result) {
	case PendingExecutionResult::NO_TASKS_AVAILABLE:
	case PendingExecutionResult::RESULT_NOT_READY:
		return StreamExecutionResult::CHUNK_NOT_READY;
	case PendingExecutionResult::EXECUTION_FINISHED:
		return StreamExecutionResult::EXECUTION_FINISHED;
	case PendingExecutionResult::EXECUTION_ERROR:
		return StreamExecutionResult::EXECUTION_ERROR;
	default:
		throw InternalException("No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
		                        EnumUtil::ToString(execution_result));
	}
}